

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpEventServer.cpp
# Opt level: O0

void __thiscall TcpEventServer::ErrorQuit(TcpEventServer *this,char *str)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  char *str_local;
  TcpEventServer *this_local;
  
  fprintf(_stderr,"%s",str);
  piVar1 = __errno_location();
  __stream = _stderr;
  if (*piVar1 != 0) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    fprintf(__stream," : %s",pcVar2);
  }
  fprintf(_stderr,"\n");
  exit(1);
}

Assistant:

void TcpEventServer::ErrorQuit(const char *str)
{
    //输出错误信息，退出程序
    fprintf(stderr, "%s", str);
    if( errno != 0 )
        fprintf(stderr, " : %s", strerror(errno));
    fprintf(stderr, "\n");
    exit(1);
}